

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::addCol(Highs *this,double cost,double lower_bound,double upper_bound,HighsInt num_new_nz,
             HighsInt *indices,double *values)

{
  HighsStatus HVar1;
  HighsInt starts;
  double *in_stack_00000068;
  double *in_stack_00000070;
  HighsInt in_stack_0000007c;
  Highs *in_stack_00000080;
  HighsInt *in_stack_000000a0;
  HighsInt *in_stack_000000a8;
  double *in_stack_000000b0;
  Highs *in_stack_ffffffffffffffa0;
  
  logHeader(in_stack_ffffffffffffffa0);
  HVar1 = addCols(in_stack_00000080,in_stack_0000007c,in_stack_00000070,in_stack_00000068,
                  (double *)this,cost._4_4_,in_stack_000000a0,in_stack_000000a8,in_stack_000000b0);
  return HVar1;
}

Assistant:

HighsStatus Highs::addCol(const double cost, const double lower_bound,
                          const double upper_bound, const HighsInt num_new_nz,
                          const HighsInt* indices, const double* values) {
  this->logHeader();
  HighsInt starts = 0;
  return addCols(1, &cost, &lower_bound, &upper_bound, num_new_nz, &starts,
                 indices, values);
}